

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Gb_Oscs.cpp
# Opt level: O0

void __thiscall Gb_Square::clock_sweep(Gb_Square *this)

{
  int iVar1;
  int iVar2;
  int offset;
  int sweep_period;
  Gb_Square *this_local;
  
  iVar1 = (int)(*(this->super_Gb_Env).super_Gb_Osc.regs & 0x70) >> 4;
  if (((iVar1 != 0) && (this->sweep_delay != 0)) &&
     (iVar2 = this->sweep_delay + -1, this->sweep_delay = iVar2, iVar2 == 0)) {
    this->sweep_delay = iVar1;
    (this->super_Gb_Env).super_Gb_Osc.regs[3] = (uint8_t)this->sweep_freq;
    (this->super_Gb_Env).super_Gb_Osc.regs[4] =
         (this->super_Gb_Env).super_Gb_Osc.regs[4] & 0xf8 | (byte)((uint)this->sweep_freq >> 8) & 7;
    offset = this->sweep_freq >> (*(this->super_Gb_Env).super_Gb_Osc.regs & 7);
    if ((*(this->super_Gb_Env).super_Gb_Osc.regs & 8) != 0) {
      offset = -offset;
    }
    this->sweep_freq = offset + this->sweep_freq;
    if (this->sweep_freq < 0) {
      this->sweep_freq = 0;
    }
    else if (0x7ff < this->sweep_freq) {
      this->sweep_delay = 0;
      this->sweep_freq = 0x800;
    }
  }
  return;
}

Assistant:

void Gb_Square::clock_sweep()
{
	int sweep_period = (regs [0] & period_mask) >> 4;
	if ( sweep_period && sweep_delay && !--sweep_delay )
	{
		sweep_delay = sweep_period;
		regs [3] = sweep_freq & 0xFF;
		regs [4] = (regs [4] & ~0x07) | (sweep_freq >> 8 & 0x07);
		
		int offset = sweep_freq >> (regs [0] & shift_mask);
		if ( regs [0] & 0x08 )
			offset = -offset;
		sweep_freq += offset;
		
		if ( sweep_freq < 0 )
		{
			sweep_freq = 0;
		}
		else if ( sweep_freq >= 2048 )
		{
			sweep_delay = 0; // don't modify channel frequency any further
			sweep_freq = 2048; // silence sound immediately
		}
	}
}